

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_shq_que.c
# Opt level: O3

int shm_queue_pull_end(QcShmQue *shmQue,int idx,QcErr *err)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  undefined4 *in_RCX;
  QcStaticList *staticList;
  undefined4 extraout_EDX;
  long *extraout_RDX;
  int cell;
  uint *puVar7;
  QcStaticList *pQVar8;
  QcErr *in_R8;
  long lVar9;
  
  puVar7 = (uint *)(ulong)(uint)idx;
  qc_sem_wait(shmQue->sem_lst,-1);
  pQVar8 = &shmQue->p_shmQue->lst_free;
  iVar3 = qc_staticlist_add_tail(pQVar8,idx);
  if (-1 < iVar3) {
    qc_sem_post(shmQue->sem_lst);
    return 0;
  }
  shm_queue_pull_end_cold_1();
  iVar5 = -1;
  cell = -1;
  qc_sem_wait(*(QcSem **)(pQVar8 + 1),-1);
  iVar3 = qc_staticlist_count((QcStaticList *)(*(long *)&pQVar8->limit + 300));
  if (iVar3 == 0) {
    qc_seterr(in_R8,-1,"alloc failed, no free unit in queue(%s).");
    qc_sem_post(*(QcSem **)(pQVar8 + 1));
  }
  else {
    staticList = (QcStaticList *)(*(long *)&pQVar8->limit + 300);
    uVar4 = qc_staticlist_get_head(staticList);
    if ((int)uVar4 < 0) {
      shm_queue_push_begin_cold_1();
      qc_sem_wait(*(QcSem **)(staticList + 1),-1);
      pQVar8 = (QcStaticList *)(*(long *)&staticList->limit + 0x144);
      iVar3 = cell;
      iVar5 = qc_staticlist_add_tail(pQVar8,cell);
      if (-1 < iVar5) {
        iVar3 = *(int *)(*(long *)&staticList->limit + 0x28);
        pcVar6 = qc_shm_getaddr(*(QcShm **)staticList);
        *(undefined4 *)
         (pcVar6 + (long)cell * ((long)iVar3 + 8) + *(long *)(*(long *)&staticList->limit + 0x15c))
             = extraout_EDX;
        qc_sem_post((QcSem *)staticList->buff_offset);
        qc_sem_post(*(QcSem **)(staticList + 1));
        return 0;
      }
      shm_queue_push_end_cold_1();
      return (int)pQVar8 + (int)pQVar8->buff_offset + iVar3 * 8;
    }
    qc_sem_post(*(QcSem **)(pQVar8 + 1));
    *puVar7 = uVar4;
    lVar9 = (ulong)uVar4 * ((long)*(int *)(*(long *)&pQVar8->limit + 0x28) + 8);
    pcVar6 = qc_shm_getaddr(*(QcShm **)pQVar8);
    lVar1 = *(long *)(*(long *)&pQVar8->limit + 0x15c);
    *extraout_RDX = (long)(pcVar6 + lVar9 + lVar1);
    lVar2 = *(long *)&pQVar8->limit;
    *in_RCX = *(undefined4 *)(lVar2 + 0x28);
    *(undefined4 *)(pcVar6 + lVar9 + lVar1) = *(undefined4 *)(lVar2 + 0x28);
    *extraout_RDX = (long)(pcVar6 + lVar9 + lVar1 + 8);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int shm_queue_pull_end(QcShmQue* shmQue, int idx, QcErr *err)
{
    int index;

    qc_sem_wait(shmQue->sem_lst, -1);
	index = qc_staticlist_add_tail(&shmQue->p_shmQue->lst_free, idx);
	qc_assert(index>=0);
    qc_sem_post(shmQue->sem_lst);

    return 0;
}